

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64 tag,char *ptr,MessageLite *containing_type,
          InternalMetadataWithArenaLite *metadata,ParseContext *ctx)

{
  bool bVar1;
  ulong in_RSI;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *in_R8;
  bool bVar2;
  ExtensionInfo extension;
  bool was_packed_on_wire;
  InternalMetadataWithArenaLite *in_stack_00000078;
  int number;
  GeneratedExtensionFinder finder;
  ParseContext *in_stack_000000f0;
  ParseContext *in_stack_ffffffffffffff18;
  ExtensionInfo *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  ExtensionSet *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff50;
  ExtensionInfo local_90;
  undefined4 local_6c;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_50;
  ulong local_38;
  char *local_28;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_20;
  Container *local_18;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_10;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_8;
  
  local_50 = in_R8;
  local_38 = in_RSI;
  GeneratedExtensionFinder::GeneratedExtensionFinder
            ((GeneratedExtensionFinder *)in_stack_ffffffffffffff20,
             (MessageLite *)in_stack_ffffffffffffff18);
  local_6c = (undefined4)(local_38 >> 3);
  ExtensionInfo::ExtensionInfo(&local_90);
  bVar1 = FindExtensionInfoFromFieldNumber
                    (in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (int)in_stack_ffffffffffffff30,(ExtensionFinder *)in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff20,(bool *)in_stack_ffffffffffffff18);
  if (bVar1) {
    local_28 = ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArenaLite>
                         ((ExtensionSet *)ctx,finder.containing_type_._4_4_,
                          finder.containing_type_._3_1_,
                          (ExtensionInfo *)finder.super_ExtensionFinder._vptr_ExtensionFinder,
                          in_stack_00000078,(char *)extension.descriptor,in_stack_000000f0);
  }
  else {
    local_20 = local_50;
    local_10 = local_50;
    local_8 = local_50;
    bVar2 = ((uint)*(undefined8 *)local_50 & 1) == 1;
    if (bVar2) {
      local_18 = InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           (local_50);
    }
    else {
      local_18 = (Container *)
                 InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::mutable_unknown_fields_slow
                           ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffff50)));
    }
    local_28 = UnknownFieldParse((uint32)((ulong)local_18 >> 0x20),in_stack_ffffffffffffff28,
                                 (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  GeneratedExtensionFinder::~GeneratedExtensionFinder((GeneratedExtensionFinder *)0x750951);
  return local_28;
}

Assistant:

const char* ExtensionSet::ParseField(
    uint64 tag, const char* ptr, const MessageLite* containing_type,
    internal::InternalMetadataWithArenaLite* metadata,
    internal::ParseContext* ctx) {
  GeneratedExtensionFinder finder(containing_type);
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromFieldNumber(tag & 7, number, &finder, &extension,
                                        &was_packed_on_wire)) {
    return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                     metadata, ptr, ctx);
}